

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

MatrixXd * __thiscall Filter::forward(MatrixXd *__return_storage_ptr__,Filter *this,MatrixXd *input)

{
  char cVar1;
  Scalar *pSVar2;
  MatrixXd *other;
  double dVar3;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)input,0,0);
  dVar3 = FIR::filter(&this->filter,*pSVar2);
  other = &this->output;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)other,0,0);
  *pSVar2 = dVar3;
  cVar1 = FIR::getType(&this->filter);
  if (cVar1 == 'h') {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)other,0,0);
    *pSVar2 = *pSVar2 + 0.5;
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
             (DenseStorage<double,__1,__1,__1,_0> *)other);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Filter::forward(Eigen::MatrixXd input) {
    output(0,0) = filter.filter(input(0,0));
    if(filter.getType() == 'h') {
        output(0,0) += 0.5;
    }
    return output;
}